

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  ulong uVar4;
  bool bVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  ulong uVar8;
  ImGuiWindow *this;
  ImGuiPopupData *pIVar9;
  ulong uVar10;
  ImGuiContext *g;
  ImRect IVar11;
  
  pIVar3 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar6 = GImGui->NavWindow, pIVar6 == (ImGuiWindow *)0x0 || (pIVar6->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar7 = GImGui->HoveredWindow;
      if (pIVar7 == (ImGuiWindow *)0x0) {
        this = (ImGuiWindow *)0x0;
      }
      else {
        this = pIVar7->RootWindow;
      }
      if ((this == (ImGuiWindow *)0x0) || ((this->Flags & 0x4000000) == 0)) {
        bVar5 = false;
      }
      else {
        uVar8 = (ulong)(GImGui->OpenPopupStack).Size;
        bVar5 = 0 < (long)uVar8;
        if (0 < (long)uVar8) {
          pIVar9 = (GImGui->OpenPopupStack).Data;
          bVar5 = true;
          if (pIVar9->PopupId != this->PopupId) {
            uVar4 = 1;
            do {
              uVar10 = uVar4;
              pIVar9 = pIVar9 + 1;
              if (uVar8 == uVar10) break;
              uVar4 = uVar10 + 1;
            } while (pIVar9->PopupId != this->PopupId);
            bVar5 = uVar10 < uVar8;
          }
        }
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if ((this == (ImGuiWindow *)0x0) || (bVar5)) {
        if ((pIVar6 != (ImGuiWindow *)0x0) && (this == (ImGuiWindow *)0x0)) {
          pIVar6 = GetTopMostPopupModal();
          if (pIVar6 == (ImGuiWindow *)0x0) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
      }
      else {
        StartMouseMovingWindow(pIVar7);
        if (((pIVar3->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((this->Flags & 1) == 0)) {
          IVar11 = ImGuiWindow::TitleBarRect(this);
          fVar1 = (pIVar3->IO).MouseClickedPos[0].x;
          if ((fVar1 < IVar11.Min.x) ||
             (((fVar2 = (pIVar3->IO).MouseClickedPos[0].y, fVar2 < IVar11.Min.y ||
               (IVar11.Max.x <= fVar1)) || (IVar11.Max.y <= fVar2)))) {
            pIVar3->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar3->HoveredIdDisabled == true) {
          pIVar3->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if ((pIVar3->IO).MouseClicked[1] == true) {
      pIVar7 = GetTopMostPopupModal();
      pIVar6 = pIVar3->HoveredWindow;
      if (pIVar6 != (ImGuiWindow *)0x0) {
        if (pIVar7 != (ImGuiWindow *)0x0) {
          bVar5 = IsWindowAbove(pIVar6,pIVar7);
          if (!bVar5) goto LAB_001e9bc4;
        }
        pIVar7 = pIVar6;
      }
LAB_001e9bc4:
      ClosePopupsOverWindow(pIVar7,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && (modal == NULL || IsWindowAbove(g.HoveredWindow, modal));
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}